

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

Sections QDateTimeEditPrivate::convertSections(Sections s)

{
  uint uVar1;
  QFlagsStorage<QDateTimeEdit::Section> QVar2;
  uint uVar3;
  QFlagsStorage<QDateTimeEdit::Section> QVar4;
  
  uVar3 = ((uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
                 super_QFlagsStorage<QDateTimeParser::Section>.i & 0xe) + 0x10;
  if (((uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
             super_QFlagsStorage<QDateTimeParser::Section>.i & 0x30) == 0) {
    uVar3 = (uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
                  super_QFlagsStorage<QDateTimeParser::Section>.i & 0xe;
  }
  uVar1 = uVar3 + 0x100;
  if (((uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
             super_QFlagsStorage<QDateTimeParser::Section>.i & 0x3100) == 0) {
    uVar1 = uVar3;
  }
  QVar4.i = (uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
                  super_QFlagsStorage<QDateTimeParser::Section>.i & 0x200 |
            uVar1 + ((uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
                           super_QFlagsStorage<QDateTimeParser::Section>.i & 1);
  QVar2.i = QVar4.i | 0x400;
  if (((uint)s.super_QFlagsStorageHelper<QDateTimeParser::Section,_4>.
             super_QFlagsStorage<QDateTimeParser::Section>.i & 0xc00) == 0) {
    QVar2.i = QVar4.i;
  }
  return (QFlagsStorageHelper<QDateTimeEdit::Section,_4>)
         (QFlagsStorageHelper<QDateTimeEdit::Section,_4>)QVar2.i;
}

Assistant:

QDateTimeEdit::Sections QDateTimeEditPrivate::convertSections(QDateTimeParser::Sections s)
{
    QDateTimeEdit::Sections ret;
    if (s & QDateTimeParser::MSecSection)
        ret |= QDateTimeEdit::MSecSection;
    if (s & QDateTimeParser::SecondSection)
        ret |= QDateTimeEdit::SecondSection;
    if (s & QDateTimeParser::MinuteSection)
        ret |= QDateTimeEdit::MinuteSection;
    if (s & (QDateTimeParser::HourSectionMask))
        ret |= QDateTimeEdit::HourSection;
    if (s & QDateTimeParser::AmPmSection)
        ret |= QDateTimeEdit::AmPmSection;
    if (s & (QDateTimeParser::DaySectionMask))
        ret |= QDateTimeEdit::DaySection;
    if (s & QDateTimeParser::MonthSection)
        ret |= QDateTimeEdit::MonthSection;
    if (s & (QDateTimeParser::YearSectionMask))
        ret |= QDateTimeEdit::YearSection;

    return ret;
}